

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc.cpp
# Opt level: O2

int __thiscall NfcFilter::init(NfcFilter *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int in_EAX;
  float in_XMM0_Da;
  float fVar3;
  undefined4 in_XMM0_Db;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar6 [16];
  
  fVar3 = in_XMM0_Da * 0.5;
  fVar4 = 1.0 / (fVar3 + 1.0);
  (this->first).base_gain = fVar4;
  (this->first).gain = fVar4;
  (this->first).b1 = 0.0;
  (this->first).a1 = (fVar3 + fVar3) / (fVar3 + 1.0);
  (this->first).z[0] = 0.0;
  fVar4 = fVar3 * 3.0;
  fVar10 = fVar4 + 1.0 + fVar3 * fVar4;
  fVar9 = fVar3 * fVar4 * 4.0;
  auVar5._0_4_ = fVar4 + fVar4 + fVar9;
  (this->second).base_gain = 1.0 / fVar10;
  (this->second).gain = 1.0 / fVar10;
  auVar6._4_8_ = 0;
  auVar6._0_4_ = auVar5._0_4_;
  auVar6._12_4_ = in_XMM0_Db;
  auVar5._8_8_ = auVar6._8_8_;
  auVar5._4_4_ = fVar9;
  auVar1._4_4_ = fVar10;
  auVar1._0_4_ = fVar10;
  auVar1._8_8_ = 0;
  auVar7 = divps(auVar5,auVar1);
  (this->second).b1 = 0.0;
  (this->second).b2 = 0.0;
  (this->second).a1 = (float)(int)auVar7._0_8_;
  (this->second).a2 = (float)(int)((ulong)auVar7._0_8_ >> 0x20);
  (this->second).z[0] = 0.0;
  (this->second).z[1] = 0.0;
  fVar4 = fVar3 * 3.6778;
  fVar10 = fVar3 * 6.4595 * fVar3;
  fVar9 = fVar3 * 2.3222;
  fVar12 = fVar4 + 1.0 + fVar10;
  fVar14 = 1.0 / ((fVar9 + 1.0) * fVar12);
  fVar10 = fVar10 * 4.0;
  (this->third).base_gain = fVar14;
  (this->third).gain = fVar14;
  (this->third).b1 = 0.0;
  (this->third).b2 = 0.0;
  auVar8._0_4_ = fVar4 + fVar4 + fVar10;
  (this->third).b3 = 0.0;
  auVar8._4_4_ = fVar10;
  auVar8._8_8_ = 0;
  auVar2._4_4_ = fVar12;
  auVar2._0_4_ = fVar12;
  auVar2._8_8_ = 0;
  auVar7 = divps(auVar8,auVar2);
  (this->third).a1 = (float)(int)auVar7._0_8_;
  (this->third).a2 = (float)(int)((ulong)auVar7._0_8_ >> 0x20);
  (this->third).a3 = (fVar9 + fVar9) / (fVar9 + 1.0);
  (this->third).z[0] = 0.0;
  (this->third).z[1] = 0.0;
  (this->third).z[2] = 0.0;
  (this->fourth).b1 = 0.0;
  (this->fourth).b2 = 0.0;
  (this->fourth).b3 = 0.0;
  (this->fourth).b4 = 0.0;
  fVar12 = fVar3 * 4.2076;
  fVar14 = fVar3 * 5.7924;
  fVar11 = fVar3 * 11.4877 * fVar3;
  fVar3 = fVar3 * 9.1401 * fVar3;
  fVar4 = fVar12 + 1.0 + fVar11;
  fVar9 = fVar14 + 1.0 + fVar3;
  fVar10 = 1.0 / (fVar9 * fVar4);
  fVar11 = fVar11 * 4.0;
  auVar13._0_4_ = fVar12 + fVar12 + fVar11;
  fVar3 = fVar3 * 4.0;
  auVar13._4_4_ = fVar11;
  auVar13._12_4_ = fVar3;
  auVar13._8_4_ = fVar14 + fVar14 + fVar3;
  auVar7._4_4_ = fVar4;
  auVar7._0_4_ = fVar4;
  auVar7._8_4_ = fVar9;
  auVar7._12_4_ = fVar9;
  auVar7 = divps(auVar13,auVar7);
  (this->fourth).base_gain = fVar10;
  (this->fourth).gain = fVar10;
  (this->fourth).a1 = (float)auVar7._0_4_;
  (this->fourth).a2 = (float)auVar7._4_4_;
  (this->fourth).a3 = (float)auVar7._8_4_;
  (this->fourth).a4 = (float)auVar7._12_4_;
  (this->fourth).z[0] = 0.0;
  (this->fourth).z[1] = 0.0;
  (this->fourth).z[2] = 0.0;
  (this->fourth).z[3] = 0.0;
  return in_EAX;
}

Assistant:

NfcFilter1 NfcFilterCreate1(const float w0, const float w1) noexcept
{
    NfcFilter1 nfc{};
    float b_00, g_0;
    float r;

    nfc.base_gain = 1.0f;
    nfc.gain = 1.0f;

    /* Calculate bass-boost coefficients. */
    r = 0.5f * w0;
    b_00 = B[1][0] * r;
    g_0 = 1.0f + b_00;

    nfc.gain *= g_0;
    nfc.b1 = 2.0f * b_00 / g_0;

    /* Calculate bass-cut coefficients. */
    r = 0.5f * w1;
    b_00 = B[1][0] * r;
    g_0 = 1.0f + b_00;

    nfc.base_gain /= g_0;
    nfc.gain /= g_0;
    nfc.a1 = 2.0f * b_00 / g_0;

    return nfc;
}